

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdFlag.c
# Opt level: O0

void Cmd_FlagUpdateValue(Abc_Frame_t *pAbc,char *key,char *value)

{
  int iVar1;
  char *local_30;
  char *newValue;
  char *oldValue;
  char *value_local;
  char *key_local;
  Abc_Frame_t *pAbc_local;
  
  if (key != (char *)0x0) {
    oldValue = value;
    value_local = key;
    key_local = (char *)pAbc;
    if (value == (char *)0x0) {
      local_30 = Extra_UtilStrsav("");
    }
    else {
      local_30 = Extra_UtilStrsav(value);
    }
    iVar1 = st__delete(*(st__table **)(key_local + 0x20),&value_local,&newValue);
    if ((iVar1 != 0) && (newValue != (char *)0x0)) {
      free(newValue);
      newValue = (char *)0x0;
    }
    st__insert(*(st__table **)(key_local + 0x20),value_local,local_30);
  }
  return;
}

Assistant:

void Cmd_FlagUpdateValue( Abc_Frame_t * pAbc, const char * key, char * value )
{
    char * oldValue, * newValue;
    if ( !key )
        return;
    if ( value )
        newValue = Extra_UtilStrsav(value);
    else
        newValue = Extra_UtilStrsav("");
//        newValue = NULL;
    if ( st__delete(pAbc->tFlags, &key, &oldValue) )
        ABC_FREE(oldValue);
    st__insert( pAbc->tFlags, key, newValue );
}